

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

bool Clasp::setOptLegacy(OptParams *out,uint32 n)

{
  bool bVar1;
  uint in_ESI;
  uint *in_RDI;
  uint local_18;
  bool local_1;
  
  if (in_ESI < 0x14) {
    *in_RDI = *in_RDI & 0xfffffffe | (uint)(3 < in_ESI);
    local_18 = in_ESI;
    if (3 < in_ESI) {
      local_18 = 0;
    }
    *in_RDI = *in_RDI & 0xffffffe7 | (local_18 & 3) << 3;
    *in_RDI = *in_RDI & 0xfffff0ff;
    *in_RDI = *in_RDI & 0x1ffff;
    if ((3 < in_ESI) && (in_ESI != 4)) {
      bVar1 = test_bit<unsigned_int>((uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
      if (bVar1) {
        *in_RDI = *in_RDI & 0xfffff0ff | (*in_RDI >> 8 & 0xf | 1) << 8;
      }
      bVar1 = test_bit<unsigned_int>((uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
      if (bVar1) {
        *in_RDI = *in_RDI & 0xfffff0ff | (*in_RDI >> 8 & 0xf | 2) << 8;
      }
      bVar1 = test_bit<unsigned_int>((uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
      if (bVar1) {
        *in_RDI = *in_RDI & 0xffffffe7 | 0x18;
      }
      bVar1 = test_bit<unsigned_int>((uint)((ulong)in_RDI >> 0x20),(uint)in_RDI);
      if (bVar1) {
        *in_RDI = *in_RDI & 0xfffff0ff | (*in_RDI >> 8 & 0xf | 4) << 8;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool setOptLegacy(OptParams& out, uint32 n) {
	if (n >= 20) { return false; }
	out.type = n < 4  ? OptParams::type_bb : OptParams::type_usc;
	out.algo = n < 4  ? n : 0;
	out.opts = 0u;
	out.kLim = 0u;
	if (n > 3 && (n -= 4u) != 0u) {
		if (test_bit(n, 0)) { out.opts |= OptParams::usc_disjoint; }
		if (test_bit(n, 1)) { out.opts |= OptParams::usc_succinct; }
		if (test_bit(n, 2)) { out.algo = OptParams::usc_pmr; }
		if (test_bit(n, 3)) { out.opts |= OptParams::usc_stratify; }
	}
	return true;
}